

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# byte_buffer.cpp
# Opt level: O0

bool __thiscall bidfx_public_api::tools::ByteBuffer::operator==(ByteBuffer *this,ByteBuffer *other)

{
  size_t sVar1;
  size_t sVar2;
  ulong local_28;
  size_t i;
  ByteBuffer *other_local;
  ByteBuffer *this_local;
  
  sVar1 = ReadableBytes(this);
  sVar2 = ReadableBytes(other);
  if (sVar1 == sVar2) {
    for (local_28 = 0; sVar1 = ReadableBytes(this), local_28 < sVar1; local_28 = local_28 + 1) {
      if (this->buf_[this->reader_index_ + local_28] != other->buf_[other->reader_index_ + local_28]
         ) {
        return false;
      }
    }
    this_local._7_1_ = true;
  }
  else {
    this_local._7_1_ = false;
  }
  return this_local._7_1_;
}

Assistant:

const bool ByteBuffer::operator==(const ByteBuffer& other) const
{
    if (ReadableBytes() != other.ReadableBytes())
    {
        return false;
    }
    for (size_t i = 0; i < ReadableBytes(); i++)
    {
        if (buf_[reader_index_ + i] != other.buf_[other.reader_index_ + i])
        {
            return false;
        }
    }
    return true;
}